

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

string * hexdumpunit_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t *buf,size_t bytelen,DumpUnitType unittype
                   )

{
  int iVar1;
  ulong uVar2;
  string local_60;
  ulong local_40;
  size_t i;
  undefined1 local_25;
  DumpUnitType local_24;
  size_t sStack_20;
  DumpUnitType unittype_local;
  size_t bytelen_local;
  uint8_t *buf_local;
  string *str;
  
  local_25 = 0;
  local_24 = unittype;
  sStack_20 = bytelen;
  bytelen_local = (size_t)buf;
  buf_local = (uint8_t *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_40 = 0; local_40 < sStack_20; local_40 = (long)iVar1 + local_40) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    dumponeunit_abi_cxx11_
              (&local_60,(uint8_t *)(bytelen_local + local_40),sStack_20 - local_40,local_24);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    iVar1 = DumpUnitSize(local_24);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string hexdumpunit(const uint8_t *buf, size_t bytelen, DumpUnitType unittype)
{
    std::string str;

    str.reserve(bytelen*3);
    for (size_t i=0 ; i<bytelen ; i+=DumpUnitSize(unittype)) {
        if (!str.empty())
            str += " ";
        str += dumponeunit(buf+i, bytelen-i, unittype);
    }

    return str;
}